

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

nng_stat * nng_stat_next(nng_stat *stat)

{
  nng_stat *pnVar1;
  
  if (stat->s_parent != (nni_stat *)0x0) {
    pnVar1 = (nng_stat *)nni_list_next(&stat->s_parent->s_children,stat);
    return pnVar1;
  }
  return (nng_stat *)0x0;
}

Assistant:

const nng_stat *
nng_stat_next(const nng_stat *stat)
{
#if NNG_ENABLE_STATS
	if (stat->s_parent == NULL) {
		return (NULL); // Root node, no siblings.
	}
	return (nni_list_next(&stat->s_parent->s_children, (void *) stat));
#else
	NNI_ARG_UNUSED(stat);
	return (NULL);
#endif
}